

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O1

Vector<float,_3,_true>
Nova::Image<float>::Byte_Color_To_Scalar_Color<3>(Vector<unsigned_char,_3,_true> *color_in)

{
  Vector<float,_3,_true> *data_copy_1;
  int i;
  long lVar1;
  float *in_RDI;
  Vector<float,_3,_true> VVar2;
  Vector<float,_3,_true> data_copy;
  Vector<float,_3,_true> vec;
  float afStack_c [3];
  
  lVar1 = 0;
  do {
    data_copy._data._M_elems[lVar1] = (float)(color_in->_data)._M_elems[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    *(undefined4 *)((long)afStack_c + lVar1) = 0x3f800000;
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  vec._data._M_elems[2] = 0.0;
  vec._data._M_elems[0] = 0.0;
  vec._data._M_elems[1] = 0.0;
  lVar1 = 0;
  do {
    vec._data._M_elems[lVar1] = afStack_c[lVar1] * 0.5;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  lVar1 = 0;
  do {
    *(float *)((long)data_copy._data._M_elems + lVar1) =
         *(float *)((long)data_copy._data._M_elems + lVar1) +
         *(float *)((long)vec._data._M_elems + lVar1);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  in_RDI[2] = data_copy._data._M_elems[2];
  *(undefined8 *)in_RDI = data_copy._data._M_elems._0_8_;
  lVar1 = 0;
  do {
    VVar2._data._M_elems[2] = *(float *)((long)in_RDI + lVar1) * 0.00390625;
    *(float *)((long)in_RDI + lVar1) = VVar2._data._M_elems[2];
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  VVar2._data._M_elems[0] = 0.00390625;
  VVar2._data._M_elems[1] = 0.0;
  return (Vector<float,_3,_true>)VVar2._data._M_elems;
}

Assistant:

static Vector<T,d> Byte_Color_To_Scalar_Color(const Vector<unsigned char,d>& color_in)
    {return (Vector<T,d>(color_in)+(T).5*Vector<T,d>(1))/(T)256;}